

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::remap_constexpr_sampler
          (CompilerMSL *this,VariableID id,MSLConstexprSampler *sampler)

{
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  CompilerError *this_00;
  long lVar4;
  byte bVar5;
  uint32_t local_1c;
  
  bVar5 = 0;
  pSVar1 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id.id);
  pSVar2 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc);
  if (pSVar2->basetype - SampledImage < 2) {
    if ((pSVar2->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      local_1c = id.id;
      pmVar3 = ::std::
               map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
               ::operator[](&this->constexpr_samplers_by_id,&local_1c);
      for (lVar4 = 0x19; lVar4 != 0; lVar4 = lVar4 + -1) {
        pmVar3->coord = sampler->coord;
        sampler = (MSLConstexprSampler *)((long)sampler + (ulong)bVar5 * -8 + 4);
        pmVar3 = (mapped_type *)((long)pmVar3 + (ulong)bVar5 * -8 + 4);
      }
      return;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Can not remap array of samplers.");
  }
  else {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Can only remap SampledImage and Sampler type.");
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerMSL::remap_constexpr_sampler(VariableID id, const MSLConstexprSampler &sampler)
{
	auto &type = get<SPIRType>(get<SPIRVariable>(id).basetype);
	if (type.basetype != SPIRType::SampledImage && type.basetype != SPIRType::Sampler)
		SPIRV_CROSS_THROW("Can only remap SampledImage and Sampler type.");
	if (!type.array.empty())
		SPIRV_CROSS_THROW("Can not remap array of samplers.");
	constexpr_samplers_by_id[id] = sampler;
}